

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

void language::formatMemberFnPtr(QTextStream *str,SignalSlot *s,OverloadUse useQOverload)

{
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  long pos;
  QTextStream *pQVar4;
  int in_EDX;
  QStringView *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  bool withOverload;
  bool isAmbiguous;
  qsizetype parenPos;
  QStringView parameters;
  QStringView functionName;
  SignalSlotOption in_stack_ffffffffffffff1c;
  QFlags<language::SignalSlotOption> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QStringView *this;
  QStringView *this_00;
  undefined1 *n;
  undefined8 in_stack_ffffffffffffff48;
  QChar ch;
  bool local_a2;
  QString local_70;
  undefined1 local_58 [16];
  QStringView local_48;
  QStringView local_38;
  QStringView local_28;
  QChar local_a;
  long local_8;
  
  ch.ucs = (char16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QStringView *)&in_RSI[1].m_data;
  QChar::QChar<char16_t,_true>(&local_a,L'(');
  qVar3 = QString::indexOf((QString *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                           ch,(qsizetype)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  local_28.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  local_28.m_size = 0xaaaaaaaaaaaaaaaa;
  this_00 = &local_38;
  QStringView::QStringView<QString,_true>
            (this,(QString *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  local_28 = QStringView::left(this_00,(qsizetype)this);
  local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  local_48.m_size = 0xaaaaaaaaaaaaaaaa;
  n = local_58;
  QStringView::QStringView<QString,_true>
            (this,(QString *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  pos = qVar3 + 1;
  QString::size((QString *)&in_RSI[1].m_data);
  local_48 = QStringView::mid(this_00,pos,(qsizetype)n);
  bVar1 = QFlags<language::SignalSlotOption>::testFlag
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  local_a2 = false;
  if (in_EDX == 0) {
    local_a2 = true;
  }
  else if (in_EDX == 1) {
    bVar2 = QStringView::empty((QStringView *)0x195cc0);
    local_a2 = true;
    if (!bVar2) {
      local_a2 = bVar1;
    }
  }
  else if (in_EDX == 2) {
    local_a2 = false;
  }
  if (local_a2 != false) {
    pQVar4 = in_RDI;
    formatOverload(in_RSI);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,&local_70);
    QTextStream::operator<<(pQVar4,'(');
    QString::~QString((QString *)0x195d28);
  }
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RDI,'&');
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)(in_RSI + 3));
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"::");
  QTextStream::operator<<(pQVar4,(QStringView *)local_28.m_size);
  if (local_a2 != false) {
    QTextStream::operator<<(in_RDI,')');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void formatMemberFnPtr(QTextStream &str, const SignalSlot &s, OverloadUse useQOverload)
{
    const qsizetype parenPos = s.signature.indexOf(u'(');
    Q_ASSERT(parenPos >= 0);
    const auto functionName = QStringView{s.signature}.left(parenPos);

    const auto parameters = QStringView{s.signature}.mid(parenPos + 1,
                                               s.signature.size() - parenPos - 2);

    const bool isAmbiguous = s.options.testFlag(SignalSlotOption::Ambiguous);
    bool withOverload = false; // just to silence the compiler

    switch (useQOverload) {
    case OverloadUse::Always:
        withOverload = true;
        break;
    case OverloadUse::Never:
        withOverload = false;
        break;
    case OverloadUse::WhenAmbiguousOrEmpty:
        withOverload = parameters.empty() || isAmbiguous;
        break;
    }

    if (withOverload)
        str << formatOverload(parameters) << '(';

    str << '&' << s.className << "::" << functionName;

    if (withOverload)
        str << ')';
}